

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.h
# Opt level: O3

void __thiscall Js::DynamicTypeHandler::SetFlags(DynamicTypeHandler *this,BYTE values)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  undefined4 *puVar5;
  
  bVar3 = this->flags;
  if ((values & 0x14) == 0x10 && (bVar3 & 4) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0xd2,
                                "((this->flags & IsLockedFlag) != 0 || (values & IsLockedFlag) != 0 || (values & IsSharedFlag) == 0)"
                                ,
                                "(this->flags & IsLockedFlag) != 0 || (values & IsLockedFlag) != 0 || (values & IsSharedFlag) == 0"
                               );
    if (!bVar2) goto LAB_00add114;
    *puVar5 = 0;
    bVar3 = this->flags;
  }
  if ((values & 0x18) == 0x10 && (bVar3 & 8) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0xd5,
                                "((this->flags & MayBecomeSharedFlag) != 0 || (values & MayBecomeSharedFlag) != 0 || (values & IsSharedFlag) == 0)"
                                ,
                                "(this->flags & MayBecomeSharedFlag) != 0 || (values & MayBecomeSharedFlag) != 0 || (values & IsSharedFlag) == 0"
                               );
    if (!bVar2) goto LAB_00add114;
    *puVar5 = 0;
    bVar3 = this->flags;
  }
  if (((((bVar3 & 0x20) == 0) && (DAT_015bf345 == '\x01')) && ((values & 0x20) != 0)) &&
     ((bVar3 & 0x18) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0xdb,
                                "((this->flags & IsPrototypeFlag) != 0 || !IsolatePrototypes() || (this->flags & (MayBecomeSharedFlag | IsSharedFlag)) == 0 || (values & IsPrototypeFlag) == 0)"
                                ,
                                "(this->flags & IsPrototypeFlag) != 0 || !IsolatePrototypes() || (this->flags & (MayBecomeSharedFlag | IsSharedFlag)) == 0 || (values & IsPrototypeFlag) == 0"
                               );
    if (!bVar2) goto LAB_00add114;
    *puVar5 = 0;
    bVar3 = this->flags;
  }
  if ((((bVar3 & 0x10) == 0) && (DAT_015bf345 == '\x01')) &&
     (((values & 0x18) != 0 && ((bVar3 & 0x20) != 0)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0xdd,
                                "((this->flags & IsSharedFlag) != 0 || !IsolatePrototypes() || (this->flags & IsPrototypeFlag) == 0 || (values & (MayBecomeSharedFlag | IsSharedFlag)) == 0)"
                                ,
                                "(this->flags & IsSharedFlag) != 0 || !IsolatePrototypes() || (this->flags & IsPrototypeFlag) == 0 || (values & (MayBecomeSharedFlag | IsSharedFlag)) == 0"
                               );
    if (!bVar2) goto LAB_00add114;
    *puVar5 = 0;
  }
  iVar4 = (*this->_vptr_DynamicTypeHandler[0x59])(this);
  if (((values & 0x10) != 0) && ((char)iVar4 != '\0')) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0xe1,
                                "(!this->HasSingletonInstance() || (values & IsSharedFlag) == 0)",
                                "!this->HasSingletonInstance() || (values & IsSharedFlag) == 0");
    if (!bVar2) {
LAB_00add114:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  this->flags = this->flags | values;
  return;
}

Assistant:

void SetFlags(BYTE values)
        {
            // Don't set a shared flag if the type handler isn't locked.
            Assert((this->flags & IsLockedFlag) != 0 || (values & IsLockedFlag) != 0 || (values & IsSharedFlag) == 0);

            // Don't set a shared flag if the type handler isn't expecting to become shared.
            Assert((this->flags & MayBecomeSharedFlag) != 0 || (values & MayBecomeSharedFlag) != 0 || (values & IsSharedFlag) == 0);

            // It's ok to set up a shared prototype type handler through a constructor (see NullTypeHandler and DeferredTypeHandler),
            // but it's not ok to change these after the fact.

            // If we isolate prototypes, don't set a prototype flag on a type handler that is shared or may become shared
            Assert((this->flags & IsPrototypeFlag) != 0 || !IsolatePrototypes() || (this->flags & (MayBecomeSharedFlag | IsSharedFlag)) == 0 || (values & IsPrototypeFlag) == 0);
            // If we isolate prototypes, don't set a shared or may become shared flag on a prototype type handler.
            Assert((this->flags & IsSharedFlag) != 0 || !IsolatePrototypes() || (this->flags & IsPrototypeFlag) == 0 || (values & (MayBecomeSharedFlag | IsSharedFlag)) == 0);

#if ENABLE_FIXED_FIELDS
            // Don't set a shared flag if this type handler has a singleton instance.
            Assert(!this->HasSingletonInstance() || (values & IsSharedFlag) == 0);
#endif

            this->flags |= values;
        }